

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

bool __thiscall
cmRuntimeDependencyArchive::GetRuntimeDependencies
          (cmRuntimeDependencyArchive *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *executables,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libraries,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *modules)

{
  pointer pbVar1;
  cmBinUtilsLinker *pcVar2;
  int iVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *exe;
  pointer pbVar5;
  long lVar6;
  pointer pbVar7;
  
  pbVar1 = (executables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (executables->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1;
      pbVar5 = (pointer)((long)pbVar5 + 0x20)) {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,0);
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  pbVar1 = (libraries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (libraries->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,2);
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  pbVar5 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pbVar1 - (long)pbVar5;
  if (0 < lVar6 >> 7) {
    lVar4 = (lVar6 >> 7) + 1;
    do {
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,3);
      pbVar7 = pbVar5;
      if ((char)iVar3 == '\0') goto LAB_004a2991;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5 + 1,3);
      pbVar7 = pbVar5 + 1;
      if ((char)iVar3 == '\0') goto LAB_004a2991;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5 + 2,3);
      pbVar7 = pbVar5 + 2;
      if ((char)iVar3 == '\0') goto LAB_004a2991;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5 + 3,3);
      pbVar7 = pbVar5 + 3;
      if ((char)iVar3 == '\0') goto LAB_004a2991;
      pbVar5 = pbVar5 + 4;
      lVar4 = lVar4 + -1;
      lVar6 = lVar6 + -0x80;
    } while (1 < lVar4);
  }
  lVar6 = lVar6 >> 5;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pbVar7 = pbVar1;
      if ((lVar6 != 3) ||
         (pcVar2 = (this->Linker)._M_t.
                   super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>
                   .super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl,
         iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,3), pbVar7 = pbVar5,
         (char)iVar3 == '\0')) goto LAB_004a2991;
      pbVar5 = pbVar5 + 1;
    }
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,3);
    pbVar7 = pbVar5;
    if ((char)iVar3 == '\0') goto LAB_004a2991;
    pbVar5 = pbVar5 + 1;
  }
  pcVar2 = (this->Linker)._M_t.
           super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
           super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
           super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
  iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,3);
  pbVar7 = pbVar5;
  if ((char)iVar3 != '\0') {
    pbVar7 = pbVar1;
  }
LAB_004a2991:
  return pbVar7 == pbVar1;
}

Assistant:

bool cmRuntimeDependencyArchive::GetRuntimeDependencies(
  const std::vector<std::string>& executables,
  const std::vector<std::string>& libraries,
  const std::vector<std::string>& modules)
{
  for (auto const& exe : executables) {
    if (!this->Linker->ScanDependencies(exe, cmStateEnums::EXECUTABLE)) {
      return false;
    }
  }
  for (auto const& lib : libraries) {
    if (!this->Linker->ScanDependencies(lib, cmStateEnums::SHARED_LIBRARY)) {
      return false;
    }
  }
  return std::all_of(
    modules.begin(), modules.end(), [this](std::string const& mod) -> bool {
      return this->Linker->ScanDependencies(mod, cmStateEnums::MODULE_LIBRARY);
    });
}